

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O3

void tnt_schema_space_free(mh_assoc_t *schema)

{
  uint uVar1;
  tnt_schema_sval *val;
  mh_int_t *pmVar2;
  char *key;
  ulong uVar3;
  uint32_t uVar4;
  int iVar5;
  sbyte sVar6;
  uint uVar7;
  mh_int_t x;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  assoc_val *local_50;
  assoc_val *local_40;
  
  uVar1 = schema->n_buckets;
  if (uVar1 == 0) {
    uVar10 = 0;
LAB_0010a2ec:
    if (uVar10 < uVar1) {
      do {
        val = (tnt_schema_sval *)schema->p[uVar10]->data;
        uVar4 = PMurHash32(0xd,&val->number,4);
        uVar1 = schema->n_buckets;
        uVar9 = (ulong)uVar4 % (ulong)uVar1;
        pmVar2 = schema->b;
        while( true ) {
          x = (mh_int_t)uVar9;
          uVar3 = uVar9 >> 4;
          uVar7 = pmVar2[uVar3];
          sVar6 = (sbyte)(x & 0xf);
          if ((((uVar7 >> (x & 0xf) & 1) != 0) &&
              (local_40 = schema->p[uVar9], (local_40->key).id_len == 4)) &&
             (val->number == *(uint32_t *)(local_40->key).id)) {
            if (x != uVar1) {
              pmVar2[uVar3] = uVar7 & ~(1 << sVar6);
              schema->size = schema->size - 1;
              if (((pmVar2[uVar3] >> sVar6) >> 0x10 & 1) == 0) {
                schema->n_dirty = schema->n_dirty - 1;
              }
              if (schema->resize_position != 0) {
                mh_assoc_del_resize(schema,x,(void *)0x0);
              }
              goto LAB_0010a3b3;
            }
            break;
          }
          if (((uVar7 >> sVar6) >> 0x10 & 1) == 0) break;
          uVar8 = x + uVar4 % (uVar1 - 1) + 1;
          uVar7 = uVar1;
          if (uVar8 < uVar1) {
            uVar7 = 0;
          }
          uVar9 = (ulong)(uVar8 - uVar7);
        }
        local_40 = (assoc_val *)0x0;
LAB_0010a3b3:
        key = val->name;
        uVar1 = val->name_len;
        uVar4 = PMurHash32(0xd,key,uVar1);
        uVar7 = schema->n_buckets;
        uVar9 = (ulong)uVar4 % (ulong)uVar7;
        pmVar2 = schema->b;
        while( true ) {
          uVar11 = (uint)uVar9;
          uVar3 = uVar9 >> 4;
          uVar8 = pmVar2[uVar3];
          sVar6 = (sbyte)(uVar11 & 0xf);
          if ((((uVar8 >> (uVar11 & 0xf) & 1) != 0) &&
              (local_50 = schema->p[uVar9], uVar1 == (local_50->key).id_len)) &&
             (iVar5 = bcmp(key,(local_50->key).id,(ulong)uVar1), iVar5 == 0)) {
            if (uVar11 != uVar7) {
              pmVar2[uVar3] = uVar8 & ~(1 << sVar6);
              schema->size = schema->size - 1;
              if (((pmVar2[uVar3] >> sVar6) >> 0x10 & 1) == 0) {
                schema->n_dirty = schema->n_dirty - 1;
              }
              if (schema->resize_position != 0) {
                mh_assoc_del_resize(schema,uVar11,(void *)0x0);
              }
              goto LAB_0010a49c;
            }
            break;
          }
          if (((uVar8 >> sVar6) >> 0x10 & 1) == 0) break;
          uVar11 = uVar11 + uVar4 % (uVar7 - 1) + 1;
          uVar8 = uVar7;
          if (uVar11 < uVar7) {
            uVar8 = 0;
          }
          uVar9 = (ulong)(uVar11 - uVar8);
        }
        local_50 = (assoc_val *)0x0;
LAB_0010a49c:
        tnt_schema_sval_free(val);
        if (local_40 != (assoc_val *)0x0) {
          tnt_mem_free(local_40);
        }
        if (local_50 != (assoc_val *)0x0) {
          tnt_mem_free(local_50);
        }
        uVar1 = schema->n_buckets;
        if (uVar10 < uVar1) {
          do {
            if (uVar1 - 1 == uVar10) {
              return;
            }
            uVar10 = uVar10 + 1;
          } while ((schema->b[uVar10 >> 4] >> (uVar10 & 0xf) & 1) == 0);
        }
      } while (uVar10 < uVar1);
    }
  }
  else {
    uVar10 = 0;
    do {
      if ((schema->b[uVar10 >> 4] >> (uVar10 & 0xf) & 1) != 0) goto LAB_0010a2ec;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  return;
}

Assistant:

static inline void
tnt_schema_space_free(struct mh_assoc_t *schema) {
	mh_int_t pos = 0;
	mh_int_t space_slot = 0;
	mh_foreach(schema, pos) {
		struct tnt_schema_sval *sval = NULL;
		sval = (*mh_assoc_node(schema, pos))->data;
		struct assoc_val *av1 = NULL, *av2 = NULL;
		do {
			struct assoc_key key_number = {
				(void *)&(sval->number),
				sizeof(uint32_t)
			};
			space_slot = mh_assoc_find(schema, &key_number, NULL);
			if (space_slot == mh_end(schema))
				break;
			av1 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		do {
			struct assoc_key key_string = {
				sval->name,
				sval->name_len
			};
			space_slot = mh_assoc_find(schema, &key_string, NULL);
			if (space_slot == mh_end(schema))
				break;
			av2 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		tnt_schema_sval_free(sval);
		if (av1) tnt_mem_free((void *)av1);
		if (av2) tnt_mem_free((void *)av2);
	}
}